

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O0

bool __thiscall btLemkeAlgorithm::greaterZero(btLemkeAlgorithm *this,btVectorXf *vector)

{
  int iVar1;
  float *pfVar2;
  int i;
  bool isGreater;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    iVar3 = local_18;
    iVar1 = btVectorX<float>::size((btVectorX<float> *)0x26639d);
    if (iVar1 <= iVar3) {
      return true;
    }
    pfVar2 = btVectorX<float>::operator[]
                       ((btVectorX<float> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    if (*pfVar2 <= 0.0 && *pfVar2 != 0.0) break;
    local_18 = local_18 + 1;
  }
  return false;
}

Assistant:

bool btLemkeAlgorithm::greaterZero(const btVectorXu & vector)
{
    bool isGreater = true;
    for (int i = 0; i < vector.size(); i++) {
      if (vector[i] < 0) {
        isGreater = false;
        break;
      }
    }

    return isGreater;
  }